

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_logger.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::FileLogger::Init
          (Error *__return_storage_ptr__,FileLogger *this,string *aFilename,LogLevel aLogLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  writer write;
  writer local_c8;
  string *local_c0;
  string local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  ErrorCode local_90;
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  paVar1 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pFVar3 = fopen((aFilename->_M_dataplus)._M_p,"w");
  if (pFVar3 == (FILE *)0x0) {
    local_c0 = (string *)&__return_storage_ptr__->mMessage;
    local_98 = paVar1;
    piVar4 = __errno_location();
    if (*piVar4 == 2) {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      pcVar5 = "failed to init file logger \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "failed to init file logger \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      local_c8.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        cVar2 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar2 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
            ::writer::operator()(&local_c8,pcVar5,"");
            goto LAB_00179f88;
          }
          cVar2 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
        ::writer::operator()(&local_c8,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                           (pcVar6,"",&local_68);
      } while (pcVar5 != "");
LAB_00179f88:
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar4);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      fmt.size_ = 0xcd;
      fmt.data_ = (char *)0x23;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"failed to init file logger \'{}\', {}",fmt,args);
      local_90 = kNotFound;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
    }
    else {
      local_68.types_[0] = string_type;
      local_68.types_[1] = cstring_type;
      pcVar5 = "failed to init file logger \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "failed to init file logger \'{}\', {}";
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x23;
      local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
      local_68.parse_funcs_[0] =
           ::fmt::v10::detail::
           parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
      local_68.parse_funcs_[1] =
           ::fmt::v10::detail::
           parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      local_c8.handler_ = &local_68;
      local_68.context_.types_ = local_68.types_;
      do {
        cVar2 = *pcVar5;
        pcVar6 = pcVar5;
        while (cVar2 != '{') {
          pcVar6 = pcVar6 + 1;
          if (pcVar6 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
            ::writer::operator()(&local_c8,pcVar5,"");
            goto LAB_00179ffb;
          }
          cVar2 = *pcVar6;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
        ::writer::operator()(&local_c8,pcVar5,pcVar6);
        pcVar5 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                           (pcVar6,"",&local_68);
      } while (pcVar5 != "");
LAB_00179ffb:
      local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
           (size_t)strerror(*piVar4);
      local_68.types_ = (type  [2])(aFilename->_M_dataplus)._M_p;
      local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           (char *)aFilename->_M_string_length;
      fmt_00.size_ = 0xcd;
      fmt_00.data_ = (char *)0x23;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&local_68;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b8,(v10 *)"failed to init file logger \'{}\', {}",fmt_00,args_00);
      local_90 = kIOError;
      local_88[0] = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_b8._M_dataplus._M_p,
                 local_b8._M_dataplus._M_p + local_b8._M_string_length);
    }
    __return_storage_ptr__->mCode = local_90;
    std::__cxx11::string::operator=(local_c0,(string *)local_88);
    if (local_88[0] != local_78) {
      operator_delete(local_88[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  else {
    this->mLogFile = (FILE *)pFVar3;
    this->mLogLevel = aLogLevel;
  }
  return __return_storage_ptr__;
}

Assistant:

Error FileLogger::Init(const std::string &aFilename, LogLevel aLogLevel)
{
    Error error;
    FILE *logFile;

    logFile = fopen(aFilename.c_str(), "w");
    if (logFile == nullptr)
    {
        if (errno == ENOENT)
        {
            ExitNow(error = ERROR_NOT_FOUND("failed to init file logger '{}', {}", aFilename, strerror(errno)));
        }
        else
        {
            ExitNow(error = ERROR_IO_ERROR("failed to init file logger '{}', {}", aFilename, strerror(errno)));
        }
    }

    mLogFile  = logFile;
    mLogLevel = aLogLevel;

exit:
    return error;
}